

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeAllEqualityTerms(Parse *pParse,WhereLevel *pLevel,int bRev,int nExtraReg,char **pzAff)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long *plVar4;
  char cVar5;
  int iReg;
  int iVar6;
  int iVar7;
  uint uVar8;
  WhereLevel *pLevel_00;
  int in_ECX;
  long in_RSI;
  Parse *in_RDI;
  undefined8 *in_R8;
  Expr *pRight;
  int r1;
  int iIdxCur;
  char *zAff;
  int nReg;
  int regBase;
  int j;
  WhereLoop *pLoop;
  WhereTerm *pTerm;
  Index *pIdx;
  Vdbe *v;
  u16 nSkip;
  u16 nEq;
  sqlite3 *db;
  Vdbe *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  
  lVar3 = *(long *)(in_RSI + 0x60);
  uVar1 = *(ushort *)(lVar3 + 0x18);
  uVar2 = *(ushort *)(lVar3 + 0x36);
  iReg = in_RDI->nMem + 1;
  iVar6 = (uint)uVar1 + in_ECX;
  in_RDI->nMem = iVar6 + in_RDI->nMem;
  db = in_RDI->db;
  sqlite3IndexAffinityStr(db,(Index *)0x20c57c);
  pLevel_00 = (WhereLevel *)
              sqlite3DbStrDup((sqlite3 *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                              (char *)in_stack_ffffffffffffff90);
  if (uVar2 != 0) {
    in_stack_ffffffffffffff9c = *(int *)(in_RSI + 8);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar6,in_stack_ffffffffffffffa8),
                      (int)((ulong)pLevel_00 >> 0x20),(int)pLevel_00,in_stack_ffffffffffffff9c,
                      in_stack_ffffffffffffff98);
    sqlite3VdbeAddOp1(in_stack_ffffffffffffff90,(int)((ulong)db >> 0x20),(int)db);
    sqlite3VdbeAddOp0(in_stack_ffffffffffffff90,(int)((ulong)db >> 0x20));
    iVar7 = sqlite3VdbeAddOp4Int
                      ((Vdbe *)CONCAT44(iVar6,in_stack_ffffffffffffffa8),
                       (int)((ulong)pLevel_00 >> 0x20),(int)pLevel_00,in_stack_ffffffffffffff9c,
                       in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    *(int *)(in_RSI + 0x14) = iVar7;
    sqlite3VdbeJumpHere(in_stack_ffffffffffffff90,(int)((ulong)db >> 0x20));
    for (iVar7 = 0; iVar7 < (int)(uint)uVar2; iVar7 = iVar7 + 1) {
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar6,in_stack_ffffffffffffffa8),
                        (int)((ulong)pLevel_00 >> 0x20),(int)pLevel_00,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
    }
  }
  for (uVar8 = (uint)uVar2; (int)uVar8 < (int)(uint)uVar1; uVar8 = uVar8 + 1) {
    plVar4 = *(long **)(*(long *)(lVar3 + 0x40) + (long)(int)uVar8 * 8);
    iVar7 = codeEqualityTerm((Parse *)CONCAT44(uVar8,iReg),
                             (WhereTerm *)CONCAT44(iVar6,in_stack_ffffffffffffffa8),pLevel_00,
                             in_stack_ffffffffffffff9c,-0x55555556,
                             (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    if (iVar7 != iReg + uVar8) {
      if (iVar6 == 1) {
        sqlite3ReleaseTempReg(in_RDI,iReg);
        iReg = iVar7;
      }
      else {
        sqlite3VdbeAddOp2(in_stack_ffffffffffffff90,(int)((ulong)db >> 0x20),(int)db,0);
      }
    }
    if ((*(ushort *)((long)plVar4 + 0x14) & 1) == 0) {
      if ((*(ushort *)((long)plVar4 + 0x14) & 0x100) == 0) {
        in_stack_ffffffffffffff90 = *(Vdbe **)(*plVar4 + 0x18);
        if (((*(ushort *)((long)plVar4 + 0x12) & 0x800) == 0) &&
           (iVar7 = sqlite3ExprCanBeNull((Expr *)in_stack_ffffffffffffff90), iVar7 != 0)) {
          sqlite3VdbeAddOp2(in_stack_ffffffffffffff90,(int)((ulong)db >> 0x20),(int)db,0);
        }
        if (in_RDI->nErr == 0) {
          cVar5 = sqlite3CompareAffinity((Expr *)db,'\0');
          if (cVar5 == 'A') {
            *(undefined1 *)((long)&pLevel_00->iLeftJoin + (long)(int)uVar8) = 0x41;
          }
          iVar7 = sqlite3ExprNeedsNoAffinityChange
                            ((Expr *)in_stack_ffffffffffffff90,
                             *(char *)((long)&pLevel_00->iLeftJoin + (long)(int)uVar8));
          if (iVar7 != 0) {
            *(undefined1 *)((long)&pLevel_00->iLeftJoin + (long)(int)uVar8) = 0x41;
          }
        }
      }
    }
    else if (((*(uint *)(*plVar4 + 4) & 0x1000) != 0) && (pLevel_00 != (WhereLevel *)0x0)) {
      *(undefined1 *)((long)&pLevel_00->iLeftJoin + (long)(int)uVar8) = 0x41;
    }
  }
  *in_R8 = pLevel_00;
  return iReg;
}

Assistant:

static int codeAllEqualityTerms(
  Parse *pParse,        /* Parsing context */
  WhereLevel *pLevel,   /* Which nested loop of the FROM we are coding */
  int bRev,             /* Reverse the order of IN operators */
  int nExtraReg,        /* Number of extra registers to allocate */
  char **pzAff          /* OUT: Set to point to affinity string */
){
  u16 nEq;                      /* The number of == or IN constraints to code */
  u16 nSkip;                    /* Number of left-most columns to skip */
  Vdbe *v = pParse->pVdbe;      /* The vm under construction */
  Index *pIdx;                  /* The index being used for this loop */
  WhereTerm *pTerm;             /* A single constraint term */
  WhereLoop *pLoop;             /* The WhereLoop object */
  int j;                        /* Loop counter */
  int regBase;                  /* Base register */
  int nReg;                     /* Number of registers to allocate */
  char *zAff;                   /* Affinity string to return */

  /* This module is only called on query plans that use an index. */
  pLoop = pLevel->pWLoop;
  assert( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 );
  nEq = pLoop->u.btree.nEq;
  nSkip = pLoop->nSkip;
  pIdx = pLoop->u.btree.pIndex;
  assert( pIdx!=0 );

  /* Figure out how many memory cells we will need then allocate them.
  */
  regBase = pParse->nMem + 1;
  nReg = nEq + nExtraReg;
  pParse->nMem += nReg;

  zAff = sqlite3DbStrDup(pParse->db,sqlite3IndexAffinityStr(pParse->db,pIdx));
  assert( zAff!=0 || pParse->db->mallocFailed );

  if( nSkip ){
    int iIdxCur = pLevel->iIdxCur;
    sqlite3VdbeAddOp3(v, OP_Null, 0, regBase, regBase+nSkip-1);
    sqlite3VdbeAddOp1(v, (bRev?OP_Last:OP_Rewind), iIdxCur);
    VdbeCoverageIf(v, bRev==0);
    VdbeCoverageIf(v, bRev!=0);
    VdbeComment((v, "begin skip-scan on %s", pIdx->zName));
    j = sqlite3VdbeAddOp0(v, OP_Goto);
    assert( pLevel->addrSkip==0 );
    pLevel->addrSkip = sqlite3VdbeAddOp4Int(v, (bRev?OP_SeekLT:OP_SeekGT),
                            iIdxCur, 0, regBase, nSkip);
    VdbeCoverageIf(v, bRev==0);
    VdbeCoverageIf(v, bRev!=0);
    sqlite3VdbeJumpHere(v, j);
    for(j=0; j<nSkip; j++){
      sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, j, regBase+j);
      testcase( pIdx->aiColumn[j]==XN_EXPR );
      VdbeComment((v, "%s", explainIndexColumnName(pIdx, j)));
    }
  }

  /* Evaluate the equality constraints
  */
  assert( zAff==0 || (int)strlen(zAff)>=nEq );
  for(j=nSkip; j<nEq; j++){
    int r1;
    pTerm = pLoop->aLTerm[j];
    assert( pTerm!=0 );
    /* The following testcase is true for indices with redundant columns.
    ** Ex: CREATE INDEX i1 ON t1(a,b,a); SELECT * FROM t1 WHERE a=0 AND b=0; */
    testcase( (pTerm->wtFlags & TERM_CODED)!=0 );
    testcase( pTerm->wtFlags & TERM_VIRTUAL );
    r1 = codeEqualityTerm(pParse, pTerm, pLevel, j, bRev, regBase+j);
    if( r1!=regBase+j ){
      if( nReg==1 ){
        sqlite3ReleaseTempReg(pParse, regBase);
        regBase = r1;
      }else{
        sqlite3VdbeAddOp2(v, OP_Copy, r1, regBase+j);
      }
    }
    if( pTerm->eOperator & WO_IN ){
      if( pTerm->pExpr->flags & EP_xIsSelect ){
        /* No affinity ever needs to be (or should be) applied to a value
        ** from the RHS of an "? IN (SELECT ...)" expression. The
        ** sqlite3FindInIndex() routine has already ensured that the
        ** affinity of the comparison has been applied to the value.  */
        if( zAff ) zAff[j] = SQLITE_AFF_BLOB;
      }
    }else if( (pTerm->eOperator & WO_ISNULL)==0 ){
      Expr *pRight = pTerm->pExpr->pRight;
      if( (pTerm->wtFlags & TERM_IS)==0 && sqlite3ExprCanBeNull(pRight) ){
        sqlite3VdbeAddOp2(v, OP_IsNull, regBase+j, pLevel->addrBrk);
        VdbeCoverage(v);
      }
      if( pParse->nErr==0 ){
        assert( pParse->db->mallocFailed==0 );
        if( sqlite3CompareAffinity(pRight, zAff[j])==SQLITE_AFF_BLOB ){
          zAff[j] = SQLITE_AFF_BLOB;
        }
        if( sqlite3ExprNeedsNoAffinityChange(pRight, zAff[j]) ){
          zAff[j] = SQLITE_AFF_BLOB;
        }
      }
    }
  }
  *pzAff = zAff;
  return regBase;
}